

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhugeint.cpp
# Opt level: O2

bool duckdb::Uhugeint::TryConvert<char_const*>(char *value,uhugeint_t *result)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  undefined1 in_R8B;
  string_t input;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 local_1c;
  
  sVar3 = strlen(value);
  uVar2 = (uint)sVar3;
  if (uVar2 < 0xd) {
    local_1c = 0;
    uStack_24 = 0;
    uStack_20 = 0;
    if (uVar2 == 0) {
      value = (char *)0x0;
    }
    else {
      switchD_00917c1c::default(&uStack_24,value,(ulong)(uVar2 & 0xf));
      value = (char *)CONCAT44(local_1c,uStack_20);
    }
  }
  else {
    uStack_24 = *(undefined4 *)value;
  }
  input.value.pointer.ptr = (char *)result;
  input.value._0_8_ = value;
  bVar1 = TryCast::Operation<duckdb::string_t,duckdb::uhugeint_t>
                    ((TryCast *)CONCAT44(uStack_24,uVar2),input,(uhugeint_t *)0x1,(bool)in_R8B);
  return bVar1;
}

Assistant:

bool Uhugeint::TryConvert(const char *value, uhugeint_t &result) {
	auto len = strlen(value);
	string_t string_val(value, UnsafeNumericCast<uint32_t>(len));
	return TryCast::Operation<string_t, uhugeint_t>(string_val, result, true);
}